

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::Formattable::getString(Formattable *this,UnicodeString *result,UErrorCode *status)

{
  if (this->fType == kString) {
    if ((this->fValue).fString == (UnicodeString *)0x0) {
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
    }
    else {
      UnicodeString::operator=(result,(this->fValue).fString);
    }
  }
  else {
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      *status = U_INVALID_FORMAT_ERROR;
    }
    UnicodeString::setToBogus(result);
  }
  return result;
}

Assistant:

UnicodeString& 
Formattable::getString(UnicodeString& result, UErrorCode& status) const 
{
    if (fType != kString) {
        setError(status, U_INVALID_FORMAT_ERROR);
        result.setToBogus();
    } else {
        if (fValue.fString == NULL) {
            setError(status, U_MEMORY_ALLOCATION_ERROR);
        } else {
            result = *fValue.fString;
        }
    }
    return result;
}